

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

Type __thiscall miniscript::Node<XOnlyPubKey>::CalcType(Node<XOnlyPubKey> *this)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  iterator iVar4;
  size_type sVar5;
  vector<miniscript::Type,_std::allocator<miniscript::Type>_> *this_00;
  int *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<const_miniscript::Node<XOnlyPubKey>_> *sub;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *__range3;
  Type z;
  Type y;
  Type x;
  iterator __end0;
  iterator __begin0;
  vector<miniscript::Type,_std::allocator<miniscript::Type>_> sub_types;
  uint32_t in_stack_00000354;
  vector<miniscript::Type,_std::allocator<miniscript::Type>_> *in_stack_00000358;
  Fragment in_stack_00000364;
  Type in_stack_00000784;
  Type in_stack_00000788;
  Type in_stack_0000078c;
  size_t in_stack_000007a0;
  size_t in_stack_000007a8;
  size_t in_stack_000007b0;
  MiniscriptContext in_stack_000007b8;
  __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_ffffffffffffff28;
  Node<XOnlyPubKey> *in_stack_ffffffffffffff30;
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  *in_stack_ffffffffffffff38;
  Type in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::vector
            ((vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
             in_stack_ffffffffffffff28);
  if (*in_RDI == 0x18) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::begin((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
             *)in_stack_ffffffffffffff30);
    iVar4 = std::
            vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
            ::end((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                   *)in_stack_ffffffffffffff30);
    while( true ) {
      bVar2 = __gnu_cxx::
              operator==<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                        ((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                          *)in_stack_ffffffffffffff38,
                         (__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                          *)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffffc8.m_flags = (uint32_t)iVar4._M_current;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                   *)in_stack_ffffffffffffff28);
      std::
      __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(in_stack_ffffffffffffff28);
      GetType(in_stack_ffffffffffffff30);
      std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::push_back
                ((vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
                 in_stack_ffffffffffffff28,(value_type *)0x2dcbd6);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_*,_std::vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>_>
                    *)in_stack_ffffffffffffff28);
    }
  }
  sVar5 = std::
          vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
          ::size((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffff28);
  if (sVar5 != 0) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[](in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_stack_ffffffffffffff28);
    GetType(in_stack_ffffffffffffff30);
  }
  sVar5 = std::
          vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
          ::size((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffff28);
  if (1 < sVar5) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[](in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_stack_ffffffffffffff28);
    GetType(in_stack_ffffffffffffff30);
  }
  sVar5 = std::
          vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
          ::size((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
                  *)in_stack_ffffffffffffff28);
  if (2 < sVar5) {
    std::
    vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
    ::operator[](in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    std::
    __shared_ptr_access<const_miniscript::Node<XOnlyPubKey>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(in_stack_ffffffffffffff28);
    GetType(in_stack_ffffffffffffff30);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28);
  std::
  vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
  ::size((vector<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<XOnlyPubKey>_>_>_>
          *)in_stack_ffffffffffffff28);
  this_00 = (vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
            std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::size
                      ((vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *)
                       in_stack_ffffffffffffff28);
  internal::ComputeType
            (in_stack_00000364,in_stack_0000078c,in_stack_00000788,in_stack_00000784,
             in_stack_00000358,in_stack_00000354,in_stack_000007a0,in_stack_000007a8,
             in_stack_000007b0,in_stack_000007b8);
  TVar3 = internal::SanitizeType(in_stack_ffffffffffffffc8);
  std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Type)TVar3.m_flags;
}

Assistant:

Type CalcType() const {
        using namespace internal;

        // THRESH has a variable number of subexpressions
        std::vector<Type> sub_types;
        if (fragment == Fragment::THRESH) {
            for (const auto& sub : subs) sub_types.push_back(sub->GetType());
        }
        // All other nodes than THRESH can be computed just from the types of the 0-3 subexpressions.
        static constexpr auto NONE_MST{""_mst};
        Type x = subs.size() > 0 ? subs[0]->GetType() : NONE_MST;
        Type y = subs.size() > 1 ? subs[1]->GetType() : NONE_MST;
        Type z = subs.size() > 2 ? subs[2]->GetType() : NONE_MST;

        return SanitizeType(ComputeType(fragment, x, y, z, sub_types, k, data.size(), subs.size(), keys.size(), m_script_ctx));
    }